

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O3

Aig_Man_t * Saig_ManCreateMiterComb(Aig_Man_t *p0,Aig_Man_t *p1,int Oper)

{
  anon_union_8_3_a781e0d5_for_Aig_Obj_t__13 aVar1;
  void *pvVar2;
  Aig_Man_t *p;
  char *pcVar3;
  Aig_Obj_t *pAVar4;
  ulong uVar5;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  Aig_Obj_t *pAVar8;
  long lVar9;
  
  if (p0->nObjs[2] != p1->nObjs[2]) {
    __assert_fail("Aig_ManCiNum(p0) == Aig_ManCiNum(p1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigMiter.c"
                  ,0xa8,"Aig_Man_t *Saig_ManCreateMiterComb(Aig_Man_t *, Aig_Man_t *, int)");
  }
  if (p0->nObjs[3] != p1->nObjs[3]) {
    __assert_fail("Aig_ManCoNum(p0) == Aig_ManCoNum(p1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigMiter.c"
                  ,0xa9,"Aig_Man_t *Saig_ManCreateMiterComb(Aig_Man_t *, Aig_Man_t *, int)");
  }
  p = Aig_ManStart(p1->vObjs->nSize + p0->vObjs->nSize);
  pcVar3 = (char *)malloc(6);
  builtin_strncpy(pcVar3,"miter",6);
  p->pName = pcVar3;
  aVar1 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  p0->pConst1->field_5 = aVar1;
  p1->pConst1->field_5 = aVar1;
  pVVar6 = p0->vCis;
  if (0 < pVVar6->nSize) {
    lVar9 = 0;
    do {
      pvVar2 = pVVar6->pArray[lVar9];
      pAVar4 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar4;
      lVar9 = lVar9 + 1;
      pVVar6 = p0->vCis;
    } while (lVar9 < pVVar6->nSize);
  }
  pVVar6 = p1->vCis;
  if (0 < pVVar6->nSize) {
    lVar9 = 0;
    do {
      if (p->vCis->nSize <= lVar9) goto LAB_006f095d;
      *(void **)((long)pVVar6->pArray[lVar9] + 0x28) = p->vCis->pArray[lVar9];
      lVar9 = lVar9 + 1;
      pVVar6 = p1->vCis;
    } while (lVar9 < pVVar6->nSize);
  }
  pVVar6 = p0->vObjs;
  if (0 < pVVar6->nSize) {
    lVar9 = 0;
    do {
      pvVar2 = pVVar6->pArray[lVar9];
      if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar2 & 1) != 0) goto LAB_006f093e;
        uVar5 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          pAVar4 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar4 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar5 + 0x28));
        }
        uVar5 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          pAVar8 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar8 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^ *(ulong *)(uVar5 + 0x28));
        }
        pAVar4 = Aig_And(p,pAVar4,pAVar8);
        *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar4;
        pVVar6 = p0->vObjs;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar6->nSize);
  }
  pVVar6 = p1->vObjs;
  if (0 < pVVar6->nSize) {
    lVar9 = 0;
    do {
      pvVar2 = pVVar6->pArray[lVar9];
      if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar2 & 1) != 0) goto LAB_006f093e;
        uVar5 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          pAVar4 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar4 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar5 + 0x28));
        }
        uVar5 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          pAVar8 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar8 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^ *(ulong *)(uVar5 + 0x28));
        }
        pAVar4 = Aig_And(p,pAVar4,pAVar8);
        *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar4;
        pVVar6 = p1->vObjs;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar6->nSize);
  }
  pVVar6 = p0->vCos;
  if (0 < pVVar6->nSize) {
    if (1 < (uint)Oper) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigMiter.c"
                    ,0xc1,"Aig_Man_t *Saig_ManCreateMiterComb(Aig_Man_t *, Aig_Man_t *, int)");
    }
    lVar9 = 0;
    do {
      pvVar2 = pVVar6->pArray[lVar9];
      if (Oper == 0) {
        if (((ulong)pvVar2 & 1) != 0) {
LAB_006f093e:
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar5 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          pAVar4 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar4 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar5 + 0x28));
        }
        if (p1->vCos->nSize <= lVar9) {
LAB_006f095d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar2 = p1->vCos->pArray[lVar9];
        if (((ulong)pvVar2 & 1) != 0) goto LAB_006f093e;
        uVar5 = *(ulong *)((long)pvVar2 + 8);
        uVar7 = uVar5 & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          pAVar8 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar8 = (Aig_Obj_t *)((ulong)((uint)uVar5 & 1) ^ *(ulong *)(uVar7 + 0x28));
        }
        pAVar4 = Aig_Exor(p,pAVar4,pAVar8);
      }
      else {
        if (((ulong)pvVar2 & 1) != 0) goto LAB_006f093e;
        uVar5 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          pAVar4 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar4 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar5 + 0x28));
        }
        if (p1->vCos->nSize <= lVar9) goto LAB_006f095d;
        pvVar2 = p1->vCos->pArray[lVar9];
        if (((ulong)pvVar2 & 1) != 0) goto LAB_006f093e;
        uVar5 = *(ulong *)((long)pvVar2 + 8);
        uVar7 = uVar5 & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          pAVar8 = (Aig_Obj_t *)0x1;
        }
        else {
          pAVar8 = (Aig_Obj_t *)((ulong)((uint)uVar5 & 1) ^ *(ulong *)(uVar7 + 0x28) ^ 1);
        }
        pAVar4 = Aig_And(p,pAVar4,pAVar8);
      }
      Aig_ObjCreateCo(p,pAVar4);
      lVar9 = lVar9 + 1;
      pVVar6 = p0->vCos;
    } while (lVar9 < pVVar6->nSize);
  }
  Aig_ManSetRegNum(p,0);
  Aig_ManCleanup(p);
  return p;
}

Assistant:

Aig_Man_t * Saig_ManCreateMiterComb( Aig_Man_t * p0, Aig_Man_t * p1, int Oper )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    assert( Aig_ManCiNum(p0) == Aig_ManCiNum(p1) );
    assert( Aig_ManCoNum(p0) == Aig_ManCoNum(p1) );
    pNew = Aig_ManStart( Aig_ManObjNumMax(p0) + Aig_ManObjNumMax(p1) );
    pNew->pName = Abc_UtilStrsav( "miter" );
    // map constant nodes
    Aig_ManConst1(p0)->pData = Aig_ManConst1(pNew);
    Aig_ManConst1(p1)->pData = Aig_ManConst1(pNew);
    // map primary inputs and register outputs
    Aig_ManForEachCi( p0, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    Aig_ManForEachCi( p1, pObj, i )
        pObj->pData = Aig_ManCi( pNew, i );
    // map internal nodes
    Aig_ManForEachNode( p0, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    Aig_ManForEachNode( p1, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create primary outputs
    Aig_ManForEachCo( p0, pObj, i )
    {
        if ( Oper == 0 ) // XOR
            pObj = Aig_Exor( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild0Copy(Aig_ManCo(p1,i)) );
        else if ( Oper == 1 ) // implication is PO(p0) -> PO(p1)  ...  complement is PO(p0) & !PO(p1) 
            pObj = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_Not(Aig_ObjChild0Copy(Aig_ManCo(p1,i))) );
        else
            assert( 0 );
        Aig_ObjCreateCo( pNew, pObj );
    }
    // cleanup
    Aig_ManSetRegNum( pNew, 0 );
    Aig_ManCleanup( pNew );
    return pNew;
}